

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O2

bool __thiscall SVGChart::PPlot::ValidateData(PPlot *this)

{
  return true;
}

Assistant:

bool PPlot::ValidateData () {
        return true;

      // check x data ascending
      for (int theI=0; theI<mPlotDataContainer.GetPlotCount ();theI++) {
        const RealPlotData *theX = dynamic_cast <const RealPlotData *> (mPlotDataContainer.GetConstXData (theI));
        if (theX && theX->size ()>0) {
          float thePrev = (*theX)[0];
          for (RealPlotData::const_iterator theJ=theX->begin ();theJ!=theX->end ();theJ++) {
            float theNext = *theJ;
            if (theNext<thePrev) {
              return false;
            }
          }
        }
      }
      return true;
    }